

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void NOPN2_GenerateResampled(ym3438_t *chip,Bit32s *buf)

{
  byte bVar1;
  Bit32u BVar2;
  uint uVar3;
  int iVar4;
  Bit32u *pBVar5;
  int iVar6;
  uint port;
  undefined8 uVar7;
  Bit32s buffer [2];
  Bit32s local_58 [2];
  int *local_50;
  Bit32u *local_48;
  Bit32u *local_40;
  Bit32u *local_38;
  
  local_38 = chip->mute + 2;
  local_40 = chip->mute + 4;
  local_48 = chip->mute + 3;
  iVar6 = chip->rateratio;
  iVar4 = chip->samplecnt;
  local_50 = buf;
  do {
    if (iVar6 - iVar4 != 0 && iVar4 <= iVar6) {
      *local_50 = (iVar4 * chip->samples[0] + (iVar6 - iVar4) * chip->oldsamples[0]) / iVar6;
      local_50[1] = (chip->samplecnt * chip->samples[1] +
                    (chip->rateratio - chip->samplecnt) * chip->oldsamples[1]) / chip->rateratio;
      chip->samplecnt = chip->samplecnt + 0x400;
      return;
    }
    *(undefined8 *)chip->oldsamples = *(undefined8 *)chip->samples;
    chip->samples[0] = 0;
    chip->samples[1] = 0;
    for (iVar6 = 0; iVar6 != 0x18; iVar6 = iVar6 + 1) {
      pBVar5 = chip->mute + 1;
      switch(chip->cycles >> 2) {
      case 0:
        break;
      case 1:
        pBVar5 = chip->mute + (ulong)chip->dacen + 5;
        break;
      case 2:
        pBVar5 = local_48;
        break;
      case 3:
        pBVar5 = chip->mute;
        break;
      case 4:
        pBVar5 = local_40;
        break;
      case 5:
        pBVar5 = local_38;
        break;
      default:
        NOPN2_Clock(chip,local_58);
        goto LAB_00138586;
      }
      BVar2 = *pBVar5;
      NOPN2_Clock(chip,local_58);
      if (BVar2 == 0) {
LAB_00138586:
        *(ulong *)chip->samples =
             CONCAT44((int)((ulong)*(undefined8 *)chip->samples >> 0x20) + local_58[1],
                      (int)*(undefined8 *)chip->samples + local_58[0]);
      }
      uVar3 = chip->writebuf_cur;
      while( true ) {
        if (chip->writebuf_samplecnt < chip->writebuf[uVar3].time) break;
        bVar1 = chip->writebuf[uVar3].port;
        if ((bVar1 & 4) == 0) break;
        port = bVar1 & 3;
        chip->writebuf[uVar3].port = (Bit8u)port;
        NOPN2_Write(chip,port,chip->writebuf[uVar3].data);
        uVar3 = chip->writebuf_cur + 1 & 0x7ff;
        chip->writebuf_cur = uVar3;
      }
      chip->writebuf_samplecnt = chip->writebuf_samplecnt + 1;
    }
    if (chip->use_filter == 0) {
      uVar7 = CONCAT44((int)((*(ulong *)chip->samples >> 0x20) * 0xb),
                       (int)((*(ulong *)chip->samples & 0xffffffff) * 0xb));
    }
    else {
      iVar6 = (int)*(undefined8 *)chip->oldsamples;
      iVar4 = (int)((ulong)*(undefined8 *)chip->oldsamples >> 0x20);
      uVar7 = CONCAT44((int)((double)((int)((*(ulong *)chip->samples >> 0x20) * 0xc) - iVar4) *
                             0.48766869871737195 + (double)iVar4),
                       (int)((double)((int)((*(ulong *)chip->samples & 0xffffffff) * 0xc) - iVar6) *
                             0.48766869871737195 + (double)iVar6));
    }
    *(undefined8 *)chip->samples = uVar7;
    iVar6 = chip->rateratio;
    iVar4 = chip->samplecnt - iVar6;
    chip->samplecnt = iVar4;
  } while( true );
}

Assistant:

void NOPN2_GenerateResampled(ym3438_t *chip, Bit32s *buf)
{
    Bit32u i;
    Bit32s buffer[2];
    Bit32u mute;
    
    while (chip->samplecnt >= chip->rateratio)
    {
        chip->oldsamples[0] = chip->samples[0];
        chip->oldsamples[1] = chip->samples[1];
        chip->samples[0] = chip->samples[1] = 0;
        for (i = 0; i < 24; i++)
        {
            switch (chip->cycles >> 2)
            {
            case 0: // Ch 2
                mute = chip->mute[1];
                break;
            case 1: // Ch 6, DAC
                mute = chip->mute[5 + chip->dacen];
                break;
            case 2: // Ch 4
                mute = chip->mute[3];
                break;
            case 3: // Ch 1
                mute = chip->mute[0];
                break;
            case 4: // Ch 5
                mute = chip->mute[4];
                break;
            case 5: // Ch 3
                mute = chip->mute[2];
                break;
            default:
                mute = 0;
                break;
            }
            NOPN2_Clock(chip, buffer);
            if (!mute)
            {
                chip->samples[0] += buffer[0];
                chip->samples[1] += buffer[1];
            }

            while (chip->writebuf[chip->writebuf_cur].time <= chip->writebuf_samplecnt)
            {
                if (!(chip->writebuf[chip->writebuf_cur].port & 0x04))
                {
                    break;
                }
                chip->writebuf[chip->writebuf_cur].port &= 0x03;
                NOPN2_Write(chip, chip->writebuf[chip->writebuf_cur].port,
                              chip->writebuf[chip->writebuf_cur].data);
                chip->writebuf_cur = (chip->writebuf_cur + 1) % NOPN_WRITEBUF_SIZE;
            }
            chip->writebuf_samplecnt++;
        }
        if(!chip->use_filter)
        {
            chip->samples[0] *= 11;
            chip->samples[1] *= 11;
        }
        else
        {
            chip->samples[0] = chip->oldsamples[0] + FILTER_CUTOFF_I * (chip->samples[0]*(11+1) - chip->oldsamples[0]);
            chip->samples[1] = chip->oldsamples[1] + FILTER_CUTOFF_I * (chip->samples[1]*(11+1) - chip->oldsamples[1]);
        }
        chip->samplecnt -= chip->rateratio;
    }
    buf[0] = (Bit32s)((chip->oldsamples[0] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[0] * chip->samplecnt) / chip->rateratio);
    buf[1] = (Bit32s)((chip->oldsamples[1] * (chip->rateratio - chip->samplecnt)
                     + chip->samples[1] * chip->samplecnt) / chip->rateratio);
    chip->samplecnt += 1 << RSM_FRAC;
}